

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APIntOps::RoundDoubleToAPInt(APIntOps *this,double Double,uint width)

{
  ulong uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  APInt AVar3;
  APInt local_78;
  undefined1 local_68 [8];
  APInt Tmp;
  APInt local_50;
  ulong local_40;
  uint64_t mantissa;
  int64_t exp;
  double dStack_28;
  bool isNeg;
  anon_union_8_2_9472fc66 T;
  double dStack_18;
  uint width_local;
  double Double_local;
  undefined8 uVar2;
  
  exp._7_1_ = (long)Double < 0;
  uVar1 = (ulong)Double >> 0x34 & 0x7ff;
  mantissa = uVar1 - 0x3ff;
  dStack_28 = Double;
  T.I._4_4_ = width;
  dStack_18 = Double;
  Double_local = (double)this;
  if ((long)mantissa < 0) {
    APInt::APInt((APInt *)this,width,0,false);
    uVar2 = extraout_RDX;
  }
  else {
    local_40 = (ulong)Double & 0xfffffffffffff | 0x10000000000000;
    if ((long)mantissa < 0x34) {
      Tmp._15_1_ = 0;
      if ((bool)exp._7_1_) {
        APInt::APInt(&local_50,width,local_40 >> (0x34U - (char)mantissa & 0x3f),false);
        Tmp._15_1_ = 1;
        AVar3 = llvm::operator-((llvm *)this,&local_50);
        uVar2 = AVar3._8_8_;
      }
      else {
        APInt::APInt((APInt *)this,width,local_40 >> (0x34U - (char)mantissa & 0x3f),false);
        uVar2 = extraout_RDX_00;
      }
      if ((Tmp._15_1_ & 1) != 0) {
        APInt::~APInt(&local_50);
        uVar2 = extraout_RDX_01;
      }
    }
    else if ((long)(uVar1 - 0x433) < (long)(ulong)width) {
      APInt::APInt((APInt *)local_68,width,local_40,false);
      APInt::operator<<=((APInt *)local_68,(int)mantissa - 0x34);
      if ((exp._7_1_ & 1) == 0) {
        APInt::APInt((APInt *)this,(APInt *)local_68);
      }
      else {
        APInt::APInt(&local_78,(APInt *)local_68);
        llvm::operator-((llvm *)this,&local_78);
        APInt::~APInt(&local_78);
      }
      APInt::~APInt((APInt *)local_68);
      uVar2 = extraout_RDX_03;
    }
    else {
      APInt::APInt((APInt *)this,width,0,false);
      uVar2 = extraout_RDX_02;
    }
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt llvm::APIntOps::RoundDoubleToAPInt(double Double, unsigned width) {
  union {
    double D;
    uint64_t I;
  } T;
  T.D = Double;

  // Get the sign bit from the highest order bit
  bool isNeg = T.I >> 63;

  // Get the 11-bit exponent and adjust for the 1023 bit bias
  int64_t exp = ((T.I >> 52) & 0x7ff) - 1023;

  // If the exponent is negative, the value is < 0 so just return 0.
  if (exp < 0)
    return APInt(width, 0u);

  // Extract the mantissa by clearing the top 12 bits (sign + exponent).
  uint64_t mantissa = (T.I & (~0ULL >> 12)) | 1ULL << 52;

  // If the exponent doesn't shift all bits out of the mantissa
  if (exp < 52)
    return isNeg ? -APInt(width, mantissa >> (52 - exp)) :
                    APInt(width, mantissa >> (52 - exp));

  // If the client didn't provide enough bits for us to shift the mantissa into
  // then the result is undefined, just return 0
  if (width <= exp - 52)
    return APInt(width, 0);

  // Otherwise, we have to shift the mantissa bits up to the right location
  APInt Tmp(width, mantissa);
  Tmp <<= (unsigned)exp - 52;
  return isNeg ? -Tmp : Tmp;
}